

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupAppendCones(Gia_Man_t *p,Gia_Man_t **ppCones,int nCones,int fOnlyRegs)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  Vec_Int_t *pVVar7;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGVar8;
  ulong uVar9;
  int iVar10;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  iVar10 = 0;
  while ((iVar10 < p->vCis->nSize && (pGVar5 = Gia_ManCi(p,iVar10), pGVar5 != (Gia_Obj_t *)0x0))) {
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar5->Value = uVar1;
    iVar10 = iVar10 + 1;
  }
  iVar10 = 0;
  while ((iVar10 < p->nObjs && (pGVar5 = Gia_ManObj(p,iVar10), pGVar5 != (Gia_Obj_t *)0x0))) {
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar2 = Gia_ObjFanin0Copy(pGVar5);
      iVar3 = Gia_ObjFanin1Copy(pGVar5);
      uVar1 = Gia_ManHashAnd(p_00,iVar2,iVar3);
      pGVar5->Value = uVar1;
    }
    iVar10 = iVar10 + 1;
  }
  iVar10 = 0;
  while ((iVar10 < p->vCos->nSize - p->nRegs &&
         (pGVar5 = Gia_ManCo(p,iVar10), pGVar5 != (Gia_Obj_t *)0x0))) {
    iVar2 = Gia_ObjFanin0Copy(pGVar5);
    uVar1 = Gia_ManAppendCo(p_00,iVar2);
    pGVar5->Value = uVar1;
    iVar10 = iVar10 + 1;
  }
  uVar9 = 0;
  uVar6 = (ulong)(uint)nCones;
  if (nCones < 1) {
    uVar6 = uVar9;
  }
  while( true ) {
    if (uVar9 == uVar6) {
      iVar10 = 0;
      while ((iVar10 < p->nRegs &&
             (pGVar5 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar10), pGVar5 != (Gia_Obj_t *)0x0
             ))) {
        iVar2 = Gia_ObjFanin0Copy(pGVar5);
        uVar1 = Gia_ManAppendCo(p_00,iVar2);
        pGVar5->Value = uVar1;
        iVar10 = iVar10 + 1;
      }
      Gia_ManHashStop(p_00);
      Gia_ManSetRegNum(p_00,p->nRegs);
      pGVar8 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar8;
    }
    pGVar8 = ppCones[uVar9];
    if (pGVar8->vCos->nSize - pGVar8->nRegs != 1) break;
    if (pGVar8->nRegs != 0) {
      __assert_fail("Gia_ManRegNum(pOne) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                    ,0x485,"Gia_Man_t *Gia_ManDupAppendCones(Gia_Man_t *, Gia_Man_t **, int, int)");
    }
    pVVar7 = pGVar8->vCis;
    if (fOnlyRegs == 0) {
      if (pVVar7->nSize != p->vCis->nSize) {
        __assert_fail("Gia_ManPiNum(pOne) == Gia_ManCiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                      ,0x489,"Gia_Man_t *Gia_ManDupAppendCones(Gia_Man_t *, Gia_Man_t **, int, int)"
                     );
      }
    }
    else if (pVVar7->nSize != p->nRegs) {
      __assert_fail("Gia_ManPiNum(pOne) == Gia_ManRegNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                    ,0x487,"Gia_Man_t *Gia_ManDupAppendCones(Gia_Man_t *, Gia_Man_t **, int, int)");
    }
    pGVar8->pObjs->Value = 0;
    iVar10 = 0;
    iVar2 = 0;
    while ((iVar2 < pVVar7->nSize - iVar10 &&
           (pGVar5 = Gia_ManCi(pGVar8,iVar2), pGVar5 != (Gia_Obj_t *)0x0))) {
      iVar10 = iVar2;
      if (fOnlyRegs != 0) {
        iVar10 = (p->vCis->nSize - p->nRegs) + iVar2;
      }
      pObj = Gia_ManCi(p_00,iVar10);
      uVar1 = Gia_Obj2Lit(p_00,pObj);
      pGVar5->Value = uVar1;
      iVar2 = iVar2 + 1;
      pVVar7 = pGVar8->vCis;
      iVar10 = pGVar8->nRegs;
    }
    iVar10 = 0;
    while ((iVar10 < pGVar8->nObjs &&
           (pGVar5 = Gia_ManObj(pGVar8,iVar10), pGVar5 != (Gia_Obj_t *)0x0))) {
      if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
        iVar2 = Gia_ObjFanin0Copy(pGVar5);
        iVar3 = Gia_ObjFanin1Copy(pGVar5);
        uVar1 = Gia_ManHashAnd(p_00,iVar2,iVar3);
        pGVar5->Value = uVar1;
      }
      iVar10 = iVar10 + 1;
    }
    iVar10 = 0;
    while ((iVar10 < pGVar8->vCos->nSize - pGVar8->nRegs &&
           (pGVar5 = Gia_ManCo(pGVar8,iVar10), pGVar5 != (Gia_Obj_t *)0x0))) {
      iVar2 = Gia_ObjFanin0Copy(pGVar5);
      uVar1 = Gia_ManAppendCo(p_00,iVar2);
      pGVar5->Value = uVar1;
      iVar10 = iVar10 + 1;
    }
    uVar9 = uVar9 + 1;
  }
  __assert_fail("Gia_ManPoNum(pOne) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                ,0x484,"Gia_Man_t *Gia_ManDupAppendCones(Gia_Man_t *, Gia_Man_t **, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManDupAppendCones( Gia_Man_t * p, Gia_Man_t ** ppCones, int nCones, int fOnlyRegs )
{
    Gia_Man_t * pNew, * pOne;
    Gia_Obj_t * pObj;
    int i, k;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    for ( k = 0; k < nCones; k++ )
    {
        pOne = ppCones[k];
        assert( Gia_ManPoNum(pOne) == 1 );
        assert( Gia_ManRegNum(pOne) == 0 );
        if ( fOnlyRegs )
            assert( Gia_ManPiNum(pOne) == Gia_ManRegNum(p) );
        else
            assert( Gia_ManPiNum(pOne) == Gia_ManCiNum(p) );
        Gia_ManConst0(pOne)->Value = 0;
        Gia_ManForEachPi( pOne, pObj, i )
            pObj->Value = Gia_ManCiLit( pNew, fOnlyRegs ? Gia_ManPiNum(p) + i : i );
        Gia_ManForEachAnd( pOne, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachPo( pOne, pObj, i )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}